

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_workgraph.cpp
# Opt level: O2

bool dxil_spv::emit_increment_output_count(Impl *impl,CallInst *inst)

{
  bool bVar1;
  bool bVar2;
  uint in_EAX;
  Id arg;
  Id IVar3;
  Id arg_00;
  Id arg_01;
  Id type_id;
  Builder *this;
  Value *pVVar4;
  Operation *this_00;
  uint uStack_38;
  uint32_t is_per_thread;
  
  uStack_38 = in_EAX;
  this = Converter::Impl::builder(impl);
  _uStack_38 = (ulong)uStack_38;
  bVar1 = get_constant_operand(&inst->super_Instruction,3,&is_per_thread);
  if (bVar1) {
    pVVar4 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,1);
    bVar2 = value_is_dx_op_instrinsic(pVVar4,AnnotateNodeHandle);
    bVar1 = false;
    if (bVar2) {
      arg = SPIRVModule::get_helper_call_id
                      (impl->spirv_module,(is_per_thread == 0) + ThreadIncrementOutputCount,0);
      IVar3 = spv::Builder::makeUintType(this,0x40);
      IVar3 = emit_load_node_input_push_parameter(impl,NodePayloadOutputAtomicBDA,IVar3);
      pVVar4 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,1);
      arg_00 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
      pVVar4 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
      arg_01 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
      type_id = spv::Builder::makeVoidType(this);
      this_00 = Converter::Impl::allocate(impl,OpFunctionCall,type_id);
      Operation::add_id(this_00,arg);
      Operation::add_id(this_00,IVar3);
      Operation::add_id(this_00,arg_00);
      Operation::add_id(this_00,arg_01);
      Converter::Impl::add(impl,this_00,false);
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool emit_increment_output_count(Converter::Impl &impl, const llvm::CallInst *inst)
{
	auto &builder = impl.builder();

	uint32_t is_per_thread = 0;
	if (!get_constant_operand(inst, 3, &is_per_thread))
		return false;

	if (!value_is_dx_op_instrinsic(inst->getOperand(1), DXIL::Op::AnnotateNodeHandle))
		return false;

	spv::Id call_id = impl.spirv_module.get_helper_call_id(
	    is_per_thread ? HelperCall::ThreadIncrementOutputCount : HelperCall::GroupIncrementOutputCount);

	spv::Id atomic_addr = emit_load_node_input_push_parameter(impl, NodePayloadOutputAtomicBDA, builder.makeUintType(64));
	spv::Id node_index = impl.get_id_for_value(inst->getOperand(1));
	spv::Id alloc_count = impl.get_id_for_value(inst->getOperand(2));

	auto *call_op = impl.allocate(spv::OpFunctionCall, builder.makeVoidType());
	call_op->add_id(call_id);
	call_op->add_id(atomic_addr);
	call_op->add_id(node_index);
	call_op->add_id(alloc_count);
	impl.add(call_op);

	return true;
}